

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall
OpenMesh::PropertyT<unsigned_short>::PropertyT
          (PropertyT<unsigned_short> *this,PropertyT<unsigned_short> *_rhs)

{
  BaseProperty::BaseProperty(&this->super_BaseProperty,&_rhs->super_BaseProperty);
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__PropertyT_001eb3b0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->data_,&_rhs->data_);
  return;
}

Assistant:

PropertyT(const PropertyT & _rhs)
      : BaseProperty( _rhs ), data_( _rhs.data_ ) {}